

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O2

shared_ptr<Histogram> runHistogramStage(Image *previous,WaterEffectOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<Histogram> sVar2;
  shared_ptr<Image> hist_img;
  Image *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  getHistogram((Histogram *)local_58,(Image *)options);
  std::make_shared<Histogram,Histogram>((Histogram *)previous);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_58 + 8));
  _Var1._M_pi = extraout_RDX;
  if (in_RDX[1].field_2._M_local_buf[0] == '\x01') {
    Histogram::toImage((Histogram *)&local_68,(uint)previous->pixels);
    std::operator+(&local_38,"output/",in_RDX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_38,"_histogram.png");
    Image::toPNG(local_68,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)previous;
  return (shared_ptr<Histogram>)sVar2.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Histogram> runHistogramStage(const Image *previous, const WaterEffectOptions *options) {
  // Obtain the histogram
  auto hist = std::make_shared<Histogram>(getHistogram(previous));

  // Optionally save the intermediate histogram as an image
  if (options->save_intermediate) {
    auto hist_img = hist->toImage();
    hist_img->toPNG("output/" + options->img_name + "_histogram.png");
  }
  return hist;
}